

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O0

void print_level(v_array<v_array<unsigned_int>_> level)

{
  size_t sVar1;
  v_array<unsigned_int> *pvVar2;
  ostream *this;
  uint *puVar3;
  size_t i;
  size_t t;
  ulong local_10;
  ulong local_8;
  
  local_8 = 0;
  while( true ) {
    sVar1 = v_array<v_array<unsigned_int>_>::size
                      ((v_array<v_array<unsigned_int>_> *)&stack0x00000008);
    if (sVar1 <= local_8) break;
    local_10 = 0;
    while( true ) {
      pvVar2 = v_array<v_array<unsigned_int>_>::operator[]
                         ((v_array<v_array<unsigned_int>_> *)&stack0x00000008,local_8);
      sVar1 = v_array<unsigned_int>::size(pvVar2);
      if (sVar1 <= local_10) break;
      this = std::operator<<((ostream *)&std::cout," ");
      pvVar2 = v_array<v_array<unsigned_int>_>::operator[]
                         ((v_array<v_array<unsigned_int>_> *)&stack0x00000008,local_8);
      puVar3 = v_array<unsigned_int>::operator[](pvVar2,local_10);
      std::ostream::operator<<(this,*puVar3);
      local_10 = local_10 + 1;
    }
    std::operator<<((ostream *)&std::cout," | ");
    local_8 = local_8 + 1;
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print_level(v_array<v_array<uint32_t>> level)
{
  for (size_t t = 0; t < level.size(); t++)
  {
    for (size_t i = 0; i < level[t].size(); i++) cout << " " << level[t][i];
    cout << " | ";
  }
  cout << endl;
}